

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics_accumulation.h
# Opt level: O2

void __thiscall sptk::StatisticsAccumulation::Buffer::~Buffer(Buffer *this)

{
  this->_vptr_Buffer = (_func_int **)&PTR__Buffer_00110c70;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->delta_).super__Vector_base<double,_std::allocator<double>_>);
  SymmetricMatrix::~SymmetricMatrix(&this->second_order_statistics_);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->first_order_statistics_).super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

virtual ~Buffer() {
    }